

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Exorcism(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  char *pcVar2;
  int local_68;
  int local_64;
  int nOutputs;
  int nInputs;
  int fVerbose;
  int fUseQCost;
  int nCubesMax;
  int Verbosity;
  int Quality;
  int c;
  char *pFileNameOut;
  char *pFileNameIn;
  Abc_Ntk_t *pNtk;
  Vec_Wec_t *vEsop;
  char **argv_local;
  Abc_Frame_t *pAStack_18;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk = (Abc_Ntk_t *)0x0;
  pFileNameOut = (char *)0x0;
  nCubesMax = 2;
  fUseQCost = 0;
  fVerbose = 20000;
  nInputs = 0;
  nOutputs = 0;
  local_64 = -1;
  local_68 = -1;
  vEsop = (Vec_Wec_t *)argv;
  argv_local._4_4_ = argc;
  pAStack_18 = pAbc;
  Extra_UtilGetoptReset();
LAB_002c285e:
  do {
    iVar1 = Extra_UtilGetopt(argv_local._4_4_,(char **)vEsop,"QVCqvh");
    if (iVar1 == -1) {
      if (argv_local._4_4_ == globalUtilOptind + 2) {
        pFileNameOut = *(char **)(&vEsop->nCap + (long)globalUtilOptind * 2);
        _Quality = *(char **)(&vEsop->nCap + (long)(globalUtilOptind + 1) * 2);
      }
      else {
        if (argv_local._4_4_ != globalUtilOptind + 1) {
          Abc_Print(-1,"Abc_CommandAbc9Exorcism(): Argument error.\n");
          goto LAB_002c2bd9;
        }
        _Quality = *(char **)(&vEsop->nCap + (long)globalUtilOptind * 2);
      }
      if ((pAStack_18->pGia == (Gia_Man_t *)0x0) && (pFileNameOut == (char *)0x0)) {
        Abc_Print(-1,"Abc_CommandAbc9Exorcism(): There is neither an AIG nor an ESOP-PLA file.\n");
        return 0;
      }
      if (pFileNameOut == (char *)0x0) {
        if (pAStack_18->pGia != (Gia_Man_t *)0x0) {
          local_64 = Gia_ManCiNum(pAStack_18->pGia);
          local_68 = Gia_ManCoNum(pAStack_18->pGia);
          Eso_ManCompute(pAStack_18->pGia,nOutputs,(Vec_Wec_t **)&pNtk);
        }
      }
      else {
        pNtk_00 = Io_ReadPla(pFileNameOut,0,0,0,1,1);
        if (pNtk_00 == (Abc_Ntk_t *)0x0) {
          printf("Reading PLA file has failed.\n");
          return 1;
        }
        local_64 = Abc_NtkCiNum(pNtk_00);
        local_68 = Abc_NtkCoNum(pNtk_00);
        pNtk = (Abc_Ntk_t *)Abc_ExorcismNtk2Esop(pNtk_00);
        if (pNtk == (Abc_Ntk_t *)0x0) {
          printf("Converting PLA to ESOP failed.\n");
          return 1;
        }
      }
      if (pNtk != (Abc_Ntk_t *)0x0) {
        Abc_ExorcismMain((Vec_Wec_t *)pNtk,local_64,local_68,_Quality,nCubesMax,fUseQCost,fVerbose,
                         nInputs);
        Vec_WecFree((Vec_Wec_t *)pNtk);
      }
      return 0;
    }
    switch(iVar1) {
    case 0x43:
      if (argv_local._4_4_ <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_002c2bd9;
      }
      fVerbose = atoi(*(char **)(&vEsop->nCap + (long)globalUtilOptind * 2));
      iVar1 = fVerbose;
      break;
    default:
      goto LAB_002c2bd9;
    case 0x51:
      if (argv_local._4_4_ <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-Q\" should be followed by an integer.\n");
        goto LAB_002c2bd9;
      }
      nCubesMax = atoi(*(char **)(&vEsop->nCap + (long)globalUtilOptind * 2));
      iVar1 = nCubesMax;
      break;
    case 0x56:
      if (argv_local._4_4_ <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-V\" should be followed by an integer.\n");
        goto LAB_002c2bd9;
      }
      fUseQCost = atoi(*(char **)(&vEsop->nCap + (long)globalUtilOptind * 2));
      iVar1 = fUseQCost;
      break;
    case 0x68:
      goto LAB_002c2bd9;
    case 0x71:
      nInputs = nInputs ^ 1;
      goto LAB_002c285e;
    case 0x76:
      nOutputs = nOutputs ^ 1;
      goto LAB_002c285e;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar1 < 0) {
LAB_002c2bd9:
      Abc_Print(-2,"usage: &exorcism [-Q N] [-V N] [-C N] -q [file_in] <file_out>\n");
      Abc_Print(-2,"                     performs heuristic exclusive sum-of-project minimization\n"
               );
      Abc_Print(-2,"        -Q N       : minimization quality [default = %d]\n",
                (ulong)(uint)nCubesMax);
      Abc_Print(-2,
                "                     increasing this number improves quality and adds to runtime\n"
               );
      Abc_Print(-2,"        -V N       : verbosity level [default = %d]\n",(ulong)(uint)fUseQCost);
      Abc_Print(-2,"                     0 = no output; 1 = outline; 2 = verbose\n");
      Abc_Print(-2,"        -C N       : maximum number of cubes in startign cover [default = %d]\n"
                ,(ulong)(uint)fVerbose);
      pcVar2 = "no";
      if (nInputs != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"        -q         : toggle using quantum cost [default = %s]\n",pcVar2);
      Abc_Print(-2,
                "        [file_in]  : optional input file in ESOP-PLA format (otherwise current AIG is used)\n"
               );
      Abc_Print(-2,"        <file_out> : output file in ESOP-PLA format\n");
      Abc_Print(-2,"\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Exorcism( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Abc_ExorcismMain( Vec_Wec_t * vEsop, int nIns, int nOuts, char * pFileNameOut, int Quality, int Verbosity, int nCubesMax, int fUseQCost );
    extern Vec_Wec_t * Abc_ExorcismNtk2Esop( Abc_Ntk_t * pNtk );

    extern Gia_Man_t * Eso_ManCompute( Gia_Man_t * pGia, int fVerbose, Vec_Wec_t ** pvRes );
    Vec_Wec_t * vEsop = NULL;
    Abc_Ntk_t * pNtk = NULL;
    char * pFileNameIn = NULL;
    char * pFileNameOut = NULL;
    int c, Quality = 2, Verbosity = 0, nCubesMax = 20000, fUseQCost = 0, fVerbose = 0;
    int nInputs = -1, nOutputs = -1;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "QVCqvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'Q':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-Q\" should be followed by an integer.\n" );
                goto usage;
            }
            Quality = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Quality < 0 )
                goto usage;
            break;
        case 'V':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-V\" should be followed by an integer.\n" );
                goto usage;
            }
            Verbosity = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Verbosity < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nCubesMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCubesMax < 0 )
                goto usage;
            break;
        case 'q':
            fUseQCost ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( argc == globalUtilOptind + 2 )
    {
        pFileNameIn = argv[globalUtilOptind];
        pFileNameOut = argv[globalUtilOptind + 1];
    }
    else if ( argc == globalUtilOptind + 1 )
    {
        pFileNameOut = argv[globalUtilOptind];
    }
    else
    {
        Abc_Print( -1, "Abc_CommandAbc9Exorcism(): Argument error.\n" );
        goto usage;
    }

    if ( pAbc->pGia == NULL && pFileNameIn == NULL )
    {
      Abc_Print( -1, "Abc_CommandAbc9Exorcism(): There is neither an AIG nor an ESOP-PLA file.\n" );
      return 0;
    }

    if ( pFileNameIn )
    {
        pNtk = Io_ReadPla( pFileNameIn, 0, 0, 0, /* no preprocessing = */1, /* check = */1 );
        if ( pNtk == NULL )
        {
            printf( "Reading PLA file has failed.\n" );
            return 1;
        }
        nInputs = Abc_NtkCiNum( pNtk );
        nOutputs = Abc_NtkCoNum( pNtk );
        vEsop = Abc_ExorcismNtk2Esop( pNtk );
        if ( vEsop == NULL )
        {
            printf( "Converting PLA to ESOP failed.\n" );
            return 1;
        }
    }
    else if ( pAbc->pGia )
    {
        // generate starting cover
        nInputs = Gia_ManCiNum( pAbc->pGia );
        nOutputs = Gia_ManCoNum( pAbc->pGia );
        Eso_ManCompute( pAbc->pGia, fVerbose, &vEsop );
    }

    if ( vEsop )
    {
        // run minimization
        Abc_ExorcismMain( vEsop, nInputs, nOutputs, pFileNameOut, Quality, Verbosity, nCubesMax, fUseQCost );
        Vec_WecFree( vEsop );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: &exorcism [-Q N] [-V N] [-C N] -q [file_in] <file_out>\n" );
    Abc_Print( -2, "                     performs heuristic exclusive sum-of-project minimization\n" );
    Abc_Print( -2, "        -Q N       : minimization quality [default = %d]\n", Quality);
    Abc_Print( -2, "                     increasing this number improves quality and adds to runtime\n");
    Abc_Print( -2, "        -V N       : verbosity level [default = %d]\n", Verbosity);
    Abc_Print( -2, "                     0 = no output; 1 = outline; 2 = verbose\n");
    Abc_Print( -2, "        -C N       : maximum number of cubes in startign cover [default = %d]\n", nCubesMax );
    Abc_Print( -2, "        -q         : toggle using quantum cost [default = %s]\n", fUseQCost? "yes": "no" );
    Abc_Print( -2, "        [file_in]  : optional input file in ESOP-PLA format (otherwise current AIG is used)\n");
    Abc_Print( -2, "        <file_out> : output file in ESOP-PLA format\n");
    Abc_Print( -2, "\n" );
    return 1;
}